

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O2

void __thiscall ami_nvar_t::nvar_entry_body_t::_read(nvar_entry_body_t *this)

{
  ucs2_string_t *puVar1;
  uint8_t uVar2;
  int32_t iVar3;
  nvar_attributes_t *pnVar4;
  ucs2_string_t *this_00;
  byte bVar5;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  this->n_guid_index = true;
  pnVar4 = (this->m__parent->m_attributes)._M_t.
           super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
           .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
  bVar5 = pnVar4->m_local_guid;
  if ((((bool)bVar5 == false) && (pnVar4->m_data_only == false)) && (pnVar4->m_valid == true)) {
    this->n_guid_index = false;
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_guid_index = uVar2;
    pnVar4 = (this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
    bVar5 = pnVar4->m_local_guid;
  }
  this->n_guid = true;
  if ((((bVar5 & 1) != 0) && (pnVar4->m_data_only == false)) && (pnVar4->m_valid == true)) {
    this->n_guid = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_70,(this->super_kstruct).m__io,0x10);
    std::__cxx11::string::operator=((string *)&this->m_guid,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pnVar4 = (this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
  }
  this->n_ascii_name = true;
  bVar5 = pnVar4->m_ascii_name;
  if ((((bool)bVar5 == true) && (pnVar4->m_data_only == false)) && (pnVar4->m_valid == true)) {
    this->n_ascii_name = false;
    kaitai::kstream::read_bytes_term_abi_cxx11_
              (&local_30,(this->super_kstruct).m__io,'\0',false,true,true);
    std::__cxx11::string::string((string *)&local_50,"ASCII",&local_71);
    kaitai::kstream::bytes_to_str(&local_70,&local_30,&local_50);
    std::__cxx11::string::operator=((string *)&this->m_ascii_name,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    pnVar4 = (this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
    bVar5 = pnVar4->m_ascii_name;
  }
  this->n_ucs2_name = true;
  if ((((bVar5 & 1) == 0) && (pnVar4->m_data_only == false)) && (pnVar4->m_valid == true)) {
    this->n_ucs2_name = false;
    this_00 = (ucs2_string_t *)operator_new(0x28);
    ucs2_string_t::ucs2_string_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
    puVar1 = (this->m_ucs2_name)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::ucs2_string_t,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::ucs2_string_t_*,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
             .super__Head_base<0UL,_ami_nvar_t::ucs2_string_t_*,_false>._M_head_impl;
    (this->m_ucs2_name)._M_t.
    super___uniq_ptr_impl<ami_nvar_t::ucs2_string_t,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_ami_nvar_t::ucs2_string_t_*,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
    .super__Head_base<0UL,_ami_nvar_t::ucs2_string_t_*,_false>._M_head_impl = this_00;
    if (puVar1 != (ucs2_string_t *)0x0) {
      (**(code **)((long)(puVar1->super_kstruct)._vptr_kstruct + 8))();
    }
  }
  this->n_invoke_data_start = true;
  iVar3 = data_start_offset(this);
  if (-1 < iVar3) {
    this->n_invoke_data_start = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_70,(this->super_kstruct).m__io,0);
    std::__cxx11::string::operator=((string *)&this->m_invoke_data_start,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  kaitai::kstream::read_bytes_full_abi_cxx11_(&local_70,(this->super_kstruct).m__io);
  std::__cxx11::string::operator=((string *)&this->m_data,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void ami_nvar_t::nvar_entry_body_t::_read() {
    n_guid_index = true;
    if ( ((!(_parent()->attributes()->local_guid())) && (!(_parent()->attributes()->data_only())) && (_parent()->attributes()->valid())) ) {
        n_guid_index = false;
        m_guid_index = m__io->read_u1();
    }
    n_guid = true;
    if ( ((_parent()->attributes()->local_guid()) && (!(_parent()->attributes()->data_only())) && (_parent()->attributes()->valid())) ) {
        n_guid = false;
        m_guid = m__io->read_bytes(16);
    }
    n_ascii_name = true;
    if ( ((_parent()->attributes()->ascii_name()) && (!(_parent()->attributes()->data_only())) && (_parent()->attributes()->valid())) ) {
        n_ascii_name = false;
        m_ascii_name = kaitai::kstream::bytes_to_str(m__io->read_bytes_term(0, false, true, true), std::string("ASCII"));
    }
    n_ucs2_name = true;
    if ( ((!(_parent()->attributes()->ascii_name())) && (!(_parent()->attributes()->data_only())) && (_parent()->attributes()->valid())) ) {
        n_ucs2_name = false;
        m_ucs2_name = std::unique_ptr<ucs2_string_t>(new ucs2_string_t(m__io, this, m__root));
    }
    n_invoke_data_start = true;
    if (data_start_offset() >= 0) {
        n_invoke_data_start = false;
        m_invoke_data_start = m__io->read_bytes(0);
    }
    m_data = m__io->read_bytes_full();
}